

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O3

void __thiscall
TPZSkylMatrix<std::complex<double>_>::~TPZSkylMatrix
          (TPZSkylMatrix<std::complex<double>_> *this,void **vtt)

{
  _func_int **pp_Var1;
  complex<double> *pcVar2;
  complex<double> **ppcVar3;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = pp_Var1;
  (*pp_Var1[0x4e])();
  (this->fStorage)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01819178;
  pcVar2 = (this->fStorage).fStore;
  if (pcVar2 != (complex<double> *)0x0) {
    operator_delete__(pcVar2);
  }
  (this->fElem)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01855428;
  ppcVar3 = (this->fElem).fStore;
  if (ppcVar3 != (complex<double> **)0x0) {
    operator_delete__(ppcVar3);
    return;
  }
  return;
}

Assistant:

virtual ~TPZSkylMatrix() { Clear(); }